

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O0

void __thiscall QAbstractSocket::~QAbstractSocket(QAbstractSocket *this)

{
  QAbstractSocketPrivate *pQVar1;
  QIODevice *in_RDI;
  QAbstractSocketPrivate *d;
  
  *(undefined ***)in_RDI = &PTR_metaObject_0049bbb0;
  pQVar1 = d_func((QAbstractSocket *)0x251b09);
  if (pQVar1->state != UnconnectedState) {
    abort((QAbstractSocket *)in_RDI);
  }
  QIODevice::~QIODevice(in_RDI);
  return;
}

Assistant:

QAbstractSocket::~QAbstractSocket()
{
    Q_D(QAbstractSocket);
#if defined(QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocket::~QAbstractSocket()");
#endif
    if (d->state != UnconnectedState)
        abort();
}